

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  string *name;
  char *pcVar5;
  TestInfo *in_RDX;
  char *in_RSI;
  TestPartResult *in_RDI;
  string detail;
  string summary;
  string location;
  TestPartResult *part;
  int i;
  int failures;
  string kTestcase;
  TestResult *result;
  TestInfo *in_stack_fffffffffffffa98;
  TestPartResult *in_stack_fffffffffffffaa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa8;
  TestResult *in_stack_fffffffffffffab0;
  allocator *in_stack_fffffffffffffac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffad8;
  allocator *paVar6;
  string *in_stack_fffffffffffffb78;
  string *value;
  string *in_stack_fffffffffffffb80;
  string *in_stack_fffffffffffffb88;
  TestPartResult *element_name;
  ostream *in_stack_fffffffffffffb90;
  TestResult *in_stack_fffffffffffffc18;
  ostream *in_stack_fffffffffffffc20;
  TimeInMillis in_stack_fffffffffffffc38;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  TestPartResult *local_2e0;
  int local_2d4;
  int local_2d0;
  allocator local_2c9;
  string local_2c8 [39];
  allocator local_2a1;
  string local_2a0 [32];
  string local_280 [39];
  allocator local_259;
  string local_258 [39];
  allocator local_231;
  string local_230 [39];
  allocator local_209;
  string local_208 [36];
  int local_1e4;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [39];
  undefined1 local_191 [40];
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [32];
  undefined4 local_58;
  allocator local_41;
  string local_40 [32];
  TestResult *local_20;
  TestInfo *local_18;
  char *local_10;
  TestPartResult *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_20 = TestInfo::result(in_RDX);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"testcase",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  bVar1 = TestInfo::is_in_another_shard(local_18);
  if (bVar1) {
    local_58 = 1;
  }
  else {
    std::operator<<((ostream *)local_8,"    <testcase");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"name",&local_79);
    pcVar4 = TestInfo::name((TestInfo *)0x16fa8c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,pcVar4,&local_a1);
    OutputXmlAttribute(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb80
                       ,in_stack_fffffffffffffb78);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    pcVar4 = TestInfo::value_param(in_stack_fffffffffffffa98);
    if (pcVar4 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c8,"value_param",&local_c9);
      pcVar4 = TestInfo::value_param(in_stack_fffffffffffffa98);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,pcVar4,&local_f1);
      OutputXmlAttribute(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                         in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    }
    pcVar4 = TestInfo::type_param(in_stack_fffffffffffffa98);
    if (pcVar4 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_118,"type_param",&local_119);
      pcVar4 = TestInfo::type_param(in_stack_fffffffffffffa98);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_140,pcVar4,&local_141);
      OutputXmlAttribute(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                         in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      std::__cxx11::string::~string(local_140);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator((allocator<char> *)&local_119);
    }
    if ((FLAGS_gtest_list_tests & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_208,"status",&local_209);
      bVar1 = TestInfo::should_run(local_18);
      pcVar4 = "notrun";
      if (bVar1) {
        pcVar4 = "run";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_230,pcVar4,&local_231);
      OutputXmlAttribute(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                         in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      std::__cxx11::string::~string(local_230);
      std::allocator<char>::~allocator((allocator<char> *)&local_231);
      std::__cxx11::string::~string(local_208);
      std::allocator<char>::~allocator((allocator<char> *)&local_209);
      paVar6 = &local_259;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_258,"time",paVar6);
      TestResult::elapsed_time(local_20);
      FormatTimeInMillisAsSeconds_abi_cxx11_(in_stack_fffffffffffffc38);
      OutputXmlAttribute(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                         in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      std::__cxx11::string::~string(local_280);
      std::__cxx11::string::~string(local_258);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a0,"classname",&local_2a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2c8,local_10,&local_2c9);
      OutputXmlAttribute(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,
                         in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
      std::__cxx11::string::~string(local_2c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
      std::__cxx11::string::~string(local_2a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
      local_2d0 = 0;
      for (local_2d4 = 0; iVar3 = local_2d4,
          iVar2 = TestResult::total_part_count((TestResult *)0x1704af), iVar3 < iVar2;
          local_2d4 = local_2d4 + 1) {
        local_2e0 = TestResult::GetTestPartResult
                              (in_stack_fffffffffffffab0,
                               (int)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
        bVar1 = TestPartResult::failed(local_2e0);
        if (bVar1) {
          local_2d0 = local_2d0 + 1;
          if (local_2d0 == 1) {
            std::operator<<((ostream *)local_8,">\n");
          }
          TestPartResult::file_name(in_stack_fffffffffffffaa0);
          iVar3 = TestPartResult::line_number(local_2e0);
          FormatCompilerIndependentFileLocation_abi_cxx11_(pcVar4,(int)((ulong)paVar6 >> 0x20));
          std::operator+(in_stack_fffffffffffffac8,(char *)in_stack_fffffffffffffac0);
          TestPartResult::summary((TestPartResult *)0x170718);
          std::operator+(in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
          std::__cxx11::string::~string(local_340);
          in_stack_fffffffffffffac8 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::operator<<((ostream *)local_8,"      <failure message=\"");
          pcVar5 = (char *)std::__cxx11::string::c_str();
          in_stack_fffffffffffffac0 = &local_381;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_380,pcVar5,in_stack_fffffffffffffac0);
          EscapeXmlAttribute(&in_stack_fffffffffffffa98->test_case_name_);
          in_stack_fffffffffffffab0 =
               (TestResult *)std::operator<<((ostream *)in_stack_fffffffffffffac8,local_360);
          std::operator<<((ostream *)in_stack_fffffffffffffab0,"\" type=\"\">");
          std::__cxx11::string::~string(local_360);
          std::__cxx11::string::~string(local_380);
          std::allocator<char>::~allocator((allocator<char> *)&local_381);
          std::operator+(in_stack_fffffffffffffac8,(char *)in_stack_fffffffffffffac0);
          in_stack_fffffffffffffaa8 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               TestPartResult::message((TestPartResult *)0x170835);
          std::operator+(in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffc38);
          in_stack_fffffffffffffaa0 = local_8;
          RemoveInvalidXmlCharacters((string *)CONCAT44(iVar3,in_stack_fffffffffffffad8));
          std::__cxx11::string::c_str();
          OutputXmlCDataSection
                    ((ostream *)in_stack_fffffffffffffab0,(char *)in_stack_fffffffffffffaa8);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffc18);
          std::operator<<((ostream *)local_8,"</failure>\n");
          std::__cxx11::string::~string(local_3a8);
          std::__cxx11::string::~string(local_320);
          std::__cxx11::string::~string(local_300);
        }
      }
      if ((local_2d0 == 0) &&
         (iVar3 = TestResult::test_property_count((TestResult *)0x170a6a), iVar3 == 0)) {
        std::operator<<((ostream *)local_8," />\n");
      }
      else {
        if (local_2d0 == 0) {
          std::operator<<((ostream *)local_8,">\n");
        }
        OutputXmlTestProperties(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
        std::operator<<((ostream *)local_8,"    </testcase>\n");
      }
      local_58 = 0;
    }
    else {
      paVar6 = &local_169;
      element_name = local_8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_168,"file",paVar6);
      name = (string *)TestInfo::file((TestInfo *)0x16ff60);
      value = (string *)local_191;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)(local_191 + 1),(char *)name,(allocator *)value);
      OutputXmlAttribute((ostream *)paVar6,(string *)element_name,name,value);
      std::__cxx11::string::~string((string *)(local_191 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_191);
      std::__cxx11::string::~string(local_168);
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b8,"line",&local_1b9);
      local_1e4 = TestInfo::line(local_18);
      StreamableToString<int>((int *)in_stack_fffffffffffffac8);
      OutputXmlAttribute((ostream *)paVar6,(string *)element_name,name,value);
      std::__cxx11::string::~string(local_1e0);
      std::__cxx11::string::~string(local_1b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
      std::operator<<((ostream *)local_8," />\n");
      local_58 = 1;
    }
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_case_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestcase = "testcase";

  if (test_info.is_in_another_shard()) {
    return;
  }

  *stream << "    <testcase";
  OutputXmlAttribute(stream, kTestcase, "name", test_info.name());

  if (test_info.value_param() != NULL) {
    OutputXmlAttribute(stream, kTestcase, "value_param",
                       test_info.value_param());
  }
  if (test_info.type_param() != NULL) {
    OutputXmlAttribute(stream, kTestcase, "type_param", test_info.type_param());
  }
  if (GTEST_FLAG(list_tests)) {
    OutputXmlAttribute(stream, kTestcase, "file", test_info.file());
    OutputXmlAttribute(stream, kTestcase, "line",
                       StreamableToString(test_info.line()));
    *stream << " />\n";
    return;
  }

  OutputXmlAttribute(stream, kTestcase, "status",
                     test_info.should_run() ? "run" : "notrun");
  OutputXmlAttribute(stream, kTestcase, "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(stream, kTestcase, "classname", test_case_name);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(summary.c_str())
              << "\" type=\"\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0 && result.test_property_count() == 0) {
    *stream << " />\n";
  } else {
    if (failures == 0) {
      *stream << ">\n";
    }
    OutputXmlTestProperties(stream, result);
    *stream << "    </testcase>\n";
  }
}